

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension)

{
  pointer pcVar1;
  Tables *pTVar2;
  double dVar3;
  Symbol symbol;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  Descriptor *pDVar7;
  string *psVar8;
  string *psVar9;
  size_t sVar10;
  long lVar11;
  FieldDescriptor FVar12;
  OptionsType *orig_options;
  size_type sVar13;
  bool bVar14;
  FieldDescriptorProto *descriptor;
  undefined4 uVar15;
  FieldDescriptor *pFVar16;
  undefined7 in_register_00000081;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong uVar18;
  DescriptorBuilder *this_00;
  SubstituteArg *in_stack_fffffffffffffd78;
  string local_280;
  undefined4 local_24c;
  DescriptorBuilder *local_248;
  FieldDescriptorProto *local_240;
  string local_238;
  string lowercase_name;
  char *end_pos;
  int local_1e8;
  char local_1e4 [36];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  FieldDescriptor *pFStack_1b8;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  pDVar7 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar7 = (Descriptor *)this->file_;
  }
  psVar8 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar7 + 8));
  if (psVar8->_M_string_length != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)psVar8,psVar8->_M_string_length,0,'\x01');
  }
  std::__cxx11::string::_M_append((char *)psVar8,(ulong)(proto->name_->_M_dataplus)._M_p);
  ValidateSymbolName(this,proto->name_,psVar8,&proto->super_Message);
  psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)result = psVar9;
  *(string **)(result + 8) = psVar8;
  *(FileDescriptor **)(result + 0x20) = this->file_;
  *(int32 *)(result + 0x28) = proto->number_;
  result[0x34] = (FieldDescriptor)is_extension;
  lowercase_name._M_dataplus._M_p = (pointer)&lowercase_name.field_2;
  pcVar1 = (proto->name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&lowercase_name,pcVar1,pcVar1 + proto->name_->_M_string_length);
  if (lowercase_name._M_string_length != 0) {
    sVar13 = 0;
    do {
      if ((byte)(lowercase_name._M_dataplus._M_p[sVar13] + 0xbfU) < 0x1a) {
        lowercase_name._M_dataplus._M_p[sVar13] = lowercase_name._M_dataplus._M_p[sVar13] | 0x20;
      }
      sVar13 = sVar13 + 1;
    } while (lowercase_name._M_string_length != sVar13);
  }
  if ((lowercase_name._M_string_length == proto->name_->_M_string_length) &&
     ((lowercase_name._M_string_length == 0 ||
      (iVar5 = bcmp(lowercase_name._M_dataplus._M_p,(proto->name_->_M_dataplus)._M_p,
                    lowercase_name._M_string_length), iVar5 == 0)))) {
    psVar8 = *(string **)result;
  }
  else {
    psVar8 = DescriptorPool::Tables::AllocateString(this->tables_,&lowercase_name);
  }
  local_24c = (undefined4)CONCAT71(in_register_00000081,is_extension);
  *(string **)(result + 0x10) = psVar8;
  pTVar2 = this->tables_;
  psVar8 = proto->name_;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_248 = this;
  local_240 = proto;
  std::__cxx11::string::reserve((ulong)&local_280);
  if (psVar8->_M_string_length != 0) {
    uVar18 = 0;
    bVar14 = false;
    do {
      bVar4 = true;
      if ((psVar8->_M_dataplus)._M_p[uVar18] != '_') {
        if (bVar14) {
          std::__cxx11::string::push_back((char)&local_280);
          bVar4 = false;
        }
        else {
          std::__cxx11::string::push_back((char)&local_280);
          bVar4 = bVar14;
        }
      }
      bVar14 = bVar4;
      uVar18 = uVar18 + 1;
    } while (uVar18 < psVar8->_M_string_length);
  }
  if ((local_280._M_string_length != 0) && ((byte)(*local_280._M_dataplus._M_p + 0xbfU) < 0x1a)) {
    *local_280._M_dataplus._M_p = *local_280._M_dataplus._M_p | 0x20;
  }
  paVar17 = &local_280.field_2;
  psVar8 = DescriptorPool::Tables::AllocateString(pTVar2,&local_280);
  descriptor = local_240;
  this_00 = local_248;
  uVar15 = local_24c;
  *(string **)(result + 0x18) = psVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar17) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  *(int *)(result + 0x2c) = descriptor->type_;
  iVar5 = descriptor->label_;
  *(int *)(result + 0x30) = iVar5;
  *(undefined8 *)(result + 0x38) = 0;
  *(undefined8 *)(result + 0x40) = 0;
  *(undefined8 *)(result + 0x48) = 0;
  *(undefined8 *)(result + 0x50) = 0;
  *(undefined8 *)(result + 0x58) = 0;
  FVar12 = SUB41((descriptor->_has_bits_[0] & 0x40) >> 6,0);
  result[0x68] = FVar12;
  if ((iVar5 == 3 & (byte)FVar12) == 1) {
    psVar8 = *(string **)(result + 8);
    local_280._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"Repeated fields can\'t have default values.","");
    AddError(this_00,psVar8,&descriptor->super_Message,DEFAULT_VALUE,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar17) {
      operator_delete(local_280._M_dataplus._M_p,
                      CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                               local_280.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((descriptor->_has_bits_[0] & 8) == 0) goto switchD_001d74cd_default;
  if ((descriptor->_has_bits_[0] & 0x40) == 0) {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(result + 0x2c) * 4)
          ) {
    case 1:
    case 3:
    case 6:
      *(undefined4 *)(result + 0x70) = 0;
      break;
    case 2:
    case 4:
    case 5:
    case 8:
      *(undefined8 *)(result + 0x70) = 0;
      break;
    case 7:
      result[0x70] = (FieldDescriptor)0x0;
      break;
    case 9:
      *(undefined1 **)(result + 0x70) = (anonymous_namespace)::kEmptyString_abi_cxx11_;
    }
    goto switchD_001d74cd_default;
  }
  end_pos = (char *)0x0;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(result + 0x2c) * 4))
  {
  case 1:
    lVar11 = strtol((descriptor->default_value_->_M_dataplus)._M_p,&end_pos,0);
    uVar6 = (undefined4)lVar11;
    goto LAB_001d78fb;
  case 2:
    psVar8 = (string *)strtoll((descriptor->default_value_->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_001d7ab7;
  case 3:
    uVar18 = strtoul((descriptor->default_value_->_M_dataplus)._M_p,&end_pos,0);
    uVar6 = (undefined4)uVar18;
LAB_001d78fb:
    *(undefined4 *)(result + 0x70) = uVar6;
    break;
  case 4:
    psVar8 = (string *)strtoull((descriptor->default_value_->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_001d7ab7;
  case 5:
    iVar5 = std::__cxx11::string::compare((char *)descriptor->default_value_);
    if (iVar5 == 0) {
      psVar8 = (string *)0x7ff0000000000000;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)descriptor->default_value_);
      if (iVar5 == 0) {
        psVar8 = (string *)0xfff0000000000000;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)descriptor->default_value_);
        if (iVar5 != 0) {
          dVar3 = NoLocaleStrtod((descriptor->default_value_->_M_dataplus)._M_p,&end_pos);
          *(double *)(result + 0x70) = dVar3;
          break;
        }
        psVar8 = (string *)0x7ff8000000000000;
      }
    }
LAB_001d7ab7:
    *(string **)(result + 0x70) = psVar8;
    break;
  case 6:
    iVar5 = std::__cxx11::string::compare((char *)descriptor->default_value_);
    if (iVar5 == 0) {
      *(undefined4 *)(result + 0x70) = 0x7f800000;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)descriptor->default_value_);
      if (iVar5 == 0) {
        *(undefined4 *)(result + 0x70) = 0xff800000;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)descriptor->default_value_);
        if (iVar5 == 0) {
          *(undefined4 *)(result + 0x70) = 0x7fc00000;
        }
        else {
          dVar3 = NoLocaleStrtod((descriptor->default_value_->_M_dataplus)._M_p,&end_pos);
          *(float *)(result + 0x70) = (float)dVar3;
        }
      }
    }
    break;
  case 7:
    iVar5 = std::__cxx11::string::compare((char *)descriptor->default_value_);
    if (iVar5 == 0) {
      result[0x70] = (FieldDescriptor)0x1;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)descriptor->default_value_);
      if (iVar5 != 0) {
        psVar8 = *(string **)(result + 8);
        local_280._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"Boolean default must be true or false.","");
        AddError(this_00,psVar8,&descriptor->super_Message,DEFAULT_VALUE,&local_280);
        goto LAB_001d7a48;
      }
      result[0x70] = (FieldDescriptor)0x0;
    }
    break;
  case 8:
    *(undefined8 *)(result + 0x70) = 0;
    break;
  case 9:
    pTVar2 = this_00->tables_;
    if (*(uint *)(result + 0x2c) != 0xc) {
      psVar8 = DescriptorPool::Tables::AllocateString(pTVar2,descriptor->default_value_);
      goto LAB_001d7ab7;
    }
    UnescapeCEscapeString(&local_280,descriptor->default_value_);
    psVar8 = DescriptorPool::Tables::AllocateString(pTVar2,&local_280);
    *(string **)(result + 0x70) = psVar8;
LAB_001d7a48:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar17) {
      operator_delete(local_280._M_dataplus._M_p,
                      CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                               local_280.field_2._M_local_buf[0]) + 1);
    }
    break;
  case 10:
    psVar8 = *(string **)(result + 8);
    local_280._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"Messages can\'t have default values.","");
    AddError(this_00,psVar8,&descriptor->super_Message,DEFAULT_VALUE,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar17) {
      operator_delete(local_280._M_dataplus._M_p,
                      CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                               local_280.field_2._M_local_buf[0]) + 1);
    }
    result[0x68] = (FieldDescriptor)0x0;
  }
  if ((end_pos != (char *)0x0) &&
     ((descriptor->default_value_->_M_string_length == 0 || (*end_pos != '\0')))) {
    psVar8 = *(string **)(result + 8);
    local_280._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"Couldn\'t parse default value.","");
    AddError(this_00,psVar8,&descriptor->super_Message,DEFAULT_VALUE,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar17) {
      operator_delete(local_280._M_dataplus._M_p,
                      CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                               local_280.field_2._M_local_buf[0]) + 1);
    }
  }
switchD_001d74cd_default:
  iVar5 = *(int *)(result + 0x28);
  if (iVar5 < 1) {
    psVar8 = *(string **)(result + 8);
    local_280._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"Field numbers must be positive integers.","");
    AddError(this_00,psVar8,&descriptor->super_Message,NUMBER,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar17) {
      local_238.field_2._M_allocated_capacity =
           CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,local_280.field_2._M_local_buf[0])
      ;
      local_238._M_dataplus._M_p = local_280._M_dataplus._M_p;
LAB_001d7640:
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
  }
  else if (iVar5 < 0x20000000 || (char)uVar15 != '\0') {
    if (iVar5 - 19000U < 1000) {
      psVar8 = *(string **)(result + 8);
      local_280._M_dataplus._M_p =
           FastInt32ToBuffer(19000,(char *)((long)&local_280._M_string_length + 4));
      sVar10 = strlen(local_280._M_dataplus._M_p);
      local_280._M_string_length = CONCAT44(local_280._M_string_length._4_4_,(int)sVar10);
      end_pos = FastInt32ToBuffer(19999,local_1e4);
      sVar10 = strlen(end_pos);
      local_1e8 = (int)sVar10;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_238,
                 (strings *)
                 "Field numbers $0 through $1 are reserved for the protocol buffer library implementation."
                 ,(char *)&local_280,(SubstituteArg *)&end_pos,&local_60,&local_90,&local_c0,
                 &local_f0,&local_120,&local_150,&local_180,&local_1b0,in_stack_fffffffffffffd78);
      descriptor = local_240;
      this_00 = local_248;
      AddError(local_248,psVar8,&local_240->super_Message,NUMBER,&local_238);
      uVar15 = local_24c;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_001d7640;
    }
  }
  else {
    psVar8 = *(string **)(result + 8);
    local_280._M_dataplus._M_p =
         FastInt32ToBuffer(0x1fffffff,(char *)((long)&local_280._M_string_length + 4));
    sVar10 = strlen(local_280._M_dataplus._M_p);
    local_280._M_string_length = CONCAT44(local_280._M_string_length._4_4_,(int)sVar10);
    end_pos = (char *)0x0;
    local_1e8 = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_238,(strings *)"Field numbers cannot be greater than $0.",(char *)&local_280,
               (SubstituteArg *)&end_pos,&local_60,&local_90,&local_c0,&local_f0,&local_120,
               &local_150,&local_180,&local_1b0,in_stack_fffffffffffffd78);
    descriptor = local_240;
    this_00 = local_248;
    AddError(local_248,psVar8,&local_240->super_Message,NUMBER,&local_238);
    uVar15 = local_24c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_001d7640;
  }
  paVar17 = &local_280.field_2;
  if ((char)uVar15 == '\0') {
    pFVar16 = result + 0x38;
    if ((descriptor->_has_bits_[0] & 0x20) == 0) goto LAB_001d76ef;
    psVar8 = *(string **)(result + 8);
    local_280._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"FieldDescriptorProto.extendee set for non-extension field.","")
    ;
    AddError(this_00,psVar8,&descriptor->super_Message,EXTENDEE,&local_280);
  }
  else {
    pFVar16 = result + 0x40;
    if ((descriptor->_has_bits_[0] & 0x20) != 0) goto LAB_001d76ef;
    psVar8 = *(string **)(result + 8);
    local_280._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"FieldDescriptorProto.extendee not set for extension field.","")
    ;
    AddError(this_00,psVar8,&descriptor->super_Message,EXTENDEE,&local_280);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar17) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
LAB_001d76ef:
  *(Descriptor **)pFVar16 = parent;
  if ((descriptor->_has_bits_[0] & 0x80) == 0) {
    *(undefined8 *)(result + 0x60) = 0;
  }
  else {
    orig_options = descriptor->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = *(OptionsType **)(FieldDescriptorProto::default_instance_ + 0x38);
    }
    AllocateOptionsImpl<google::protobuf::FieldDescriptor>
              (this_00,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  local_1c0 = 2;
  symbol._4_4_ = uStack_1bc;
  symbol.type = 2;
  symbol.field_1.field_descriptor = result;
  pFStack_1b8 = result;
  AddSymbol(this_00,*(string **)(result + 8),parent,*(string **)result,&descriptor->super_Message,
            symbol);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lowercase_name._M_dataplus._M_p != &lowercase_name.field_2) {
    operator_delete(lowercase_name._M_dataplus._M_p,lowercase_name.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              const Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_         = tables_->AllocateString(proto.name());
  result->full_name_    = full_name;
  result->file_         = file_;
  result->number_       = proto.number();
  result->is_extension_ = is_extension;

  // If .proto files follow the style guide then the name should already be
  // lower-cased.  If that's the case we can just reuse the string we already
  // allocated rather than allocate a new one.
  string lowercase_name(proto.name());
  LowerString(&lowercase_name);
  if (lowercase_name == proto.name()) {
    result->lowercase_name_ = result->name_;
  } else {
    result->lowercase_name_ = tables_->AllocateString(lowercase_name);
  }

  // Don't bother with the above optimization for camel-case names since
  // .proto files that follow the guide shouldn't be using names in this
  // format, so the optimization wouldn't help much.
  result->camelcase_name_ = tables_->AllocateString(ToCamelCase(proto.name()));

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  result->type_  = static_cast<FieldDescriptor::Type>(
                     implicit_cast<int>(proto.type()));
  result->label_ = static_cast<FieldDescriptor::Label>(
                     implicit_cast<int>(proto.label()));

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = NULL;
  result->extension_scope_ = NULL;
  result->experimental_map_key_ = NULL;
  result->message_type_ = NULL;
  result->enum_type_ = NULL;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = NULL;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ =
            strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ =
            strto64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ =
            strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ =
            strtou64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ = numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ = -numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ = numeric_limits<float>::quiet_NaN();
          } else  {
            result->default_value_float_ =
              NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ = numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ = -numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ = numeric_limits<double>::quiet_NaN();
          } else  {
            result->default_value_double_ =
              NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            result->default_value_string_ = tables_->AllocateString(
              UnescapeCEscapeString(proto.default_value()));
          } else {
            result->default_value_string_ =
                tables_->AllocateString(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          break;
      }

      if (end_pos != NULL) {
        // end_pos is only set non-NULL by the parsers for numeric types, above.
        // This checks that the default was non-empty and had no extra junk
        // after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Couldn't parse default value.");
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &kEmptyString;
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          break;
      }
    }
  }

  if (result->number() <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute("Field numbers cannot be greater than $0.",
                                 FieldDescriptor::kMaxNumber));
  } else if (result->number() >= FieldDescriptor::kFirstReservedNumber &&
             result->number() <= FieldDescriptor::kLastReservedNumber) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute(
               "Field numbers $0 through $1 are reserved for the protocol "
               "buffer library implementation.",
               FieldDescriptor::kFirstReservedNumber,
               FieldDescriptor::kLastReservedNumber));
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->extension_scope_ = parent;
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}